

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prime.cpp
# Opt level: O1

bool isprime(ll p)

{
  long lVar1;
  undefined1 auVar2 [8];
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  initializer_list<long_long> __l;
  undefined1 local_70 [8];
  vector<long_long,_std::allocator<long_long>_> wit;
  allocator_type local_31;
  
  wit.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x2;
  __l._M_len = 3;
  __l._M_array = (iterator)
                 &wit.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)local_70,__l,&local_31);
  if (local_70 !=
      (undefined1  [8])
      wit.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar1 = 0;
    auVar2 = local_70;
    do {
      lVar1 = lVar1 + (ulong)(*(long *)auVar2 == p);
      auVar2 = (undefined1  [8])((long)auVar2 + 8);
    } while (auVar2 != (undefined1  [8])
                       wit.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_start);
    bVar8 = true;
    if (lVar1 != 0) goto LAB_0011dca8;
  }
  iVar4 = 0;
  bVar8 = false;
  if ((p & 1U) != 0 && 1 < p) {
    uVar3 = p - 1U;
    do {
      uVar7 = uVar3;
      iVar4 = iVar4 + 1;
      uVar3 = uVar7 >> 1;
    } while ((uVar7 & 2) == 0);
    bVar8 = local_70 ==
            (undefined1  [8])
            wit.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start;
    if (!bVar8) {
      auVar2 = local_70;
      do {
        uVar3 = (ulong)(p != 1);
        if (uVar7 != 0) {
          lVar1 = *(long *)auVar2 % p + p;
          uVar6 = uVar7 >> 1;
          do {
            lVar1 = lVar1 % p;
            if ((uVar6 & 1) != 0) {
              uVar3 = (long)(uVar3 * lVar1) % p;
            }
            lVar1 = lVar1 * lVar1;
            bVar9 = 1 < uVar6;
            uVar6 = uVar6 >> 1;
          } while (bVar9);
        }
        bVar9 = uVar3 == 1;
        iVar5 = iVar4;
        do {
          bVar9 = (bool)(bVar9 | uVar3 == p - 1U);
          uVar3 = (uVar3 * uVar3) % (ulong)p;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        if (!bVar9) break;
        auVar2 = (undefined1  [8])((long)auVar2 + 8);
        bVar8 = auVar2 == (undefined1  [8])
                          wit.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                          super__Vector_impl_data._M_start;
      } while (!bVar8);
    }
  }
LAB_0011dca8:
  if (local_70 != (undefined1  [8])0x0) {
    operator_delete((void *)local_70);
  }
  return bVar8;
}

Assistant:

bool isprime(ll p) {
	vector<ll> wit = {2, 7, 61};
	// For p < 1e18, use 2, 3, 5, 7, 11, 13, 17, 19, 23, 29, 31, 37
	// plus KACTL mod_pow (which can multiply modulo m ≤ 1e18)
	if (count(wit.begin(), wit.end(), p))
		return true;
	if (p < 2 || !(p % 2))
		return false;
	int cnt = 0;
	ll d = p - 1;
	while (d % 2 == 0)
		d /= 2, cnt++;
	/// It's been proven testing only these witnesses suffices for all p that
	/// concern us
	for (ll a: wit) {
		bool passed = false;
		ll ad = fastexp(a, d, p);
		passed |= ad == 1;
		for (int i = 0; i < cnt; i++, ad = (ad * ad) % p)
			passed |= ad == p - 1;
		if (!passed)
			return false;
	}
	return true;
}